

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

Rule * Parser::getRule(Rule *__return_storage_ptr__,int id)

{
  Node local_18;
  
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->rights).super__Vector_base<Parser::Node,_std::allocator<Parser::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = (Node)((ulong)(uint)id << 0x20);
  std::vector<Parser::Node,_std::allocator<Parser::Node>_>::_M_realloc_insert<Parser::Node>
            (&__return_storage_ptr__->rights,(iterator)0x0,&local_18);
  return __return_storage_ptr__;
}

Assistant:

Rule getRule(int id){
        Rule res;
        res.rights.clear();
        res.rights.push_back(getNode(id));
        return res;
    }